

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gizmo.c
# Opt level: O0

void golf_gizmo_init(golf_gizmo_t *gizmo)

{
  golf_gizmo_t *gizmo_local;
  
  gizmo->is_on = false;
  gizmo->is_active = false;
  gizmo->is_hovered = false;
  gizmo->operation = GOLF_GIZMO_TRANSLATE;
  gizmo->mode = GOLF_GIZMO_LOCAL;
  (gizmo->translate).snap = 0.25;
  (gizmo->rotate).snap = 22.5;
  (gizmo->scale).snap = 0.25;
  return;
}

Assistant:

void golf_gizmo_init(golf_gizmo_t *gizmo) {
    gizmo->is_on = false;
    gizmo->is_active = false;
    gizmo->is_hovered = false;
    gizmo->operation = GOLF_GIZMO_TRANSLATE;
    gizmo->mode = GOLF_GIZMO_LOCAL;
    gizmo->translate.snap = 0.25f;
    gizmo->rotate.snap = 22.5f;
    gizmo->scale.snap = 0.25f;
}